

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  _Bool _Var1;
  int iVar2;
  Curl_easy *pCVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  uint uVar7;
  timediff_t tVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  curltime cVar12;
  curltime newer;
  curltime older;
  
  pCVar3 = conn->data;
  pvVar4 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar4 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar4 + 0x18));
  iVar2 = *(int *)((long)pvVar4 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar4 + 0x18));
  if (iVar2 != 0) {
    pvVar4 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar4 + 0x34),*(Curl_addrinfo **)((long)pvVar4 + 0x38));
    *(undefined8 *)((long)pvVar4 + 0x38) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
      return CURLE_OK;
    }
    _Var1 = (conn->bits).httpproxy;
    pcVar10 = "host";
    if (_Var1 != false) {
      pcVar10 = "proxy";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar10,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return CURLE_COULDNT_RESOLVE_HOST - _Var1;
  }
  cVar12 = Curl_now();
  uVar5 = (pCVar3->progress).t_startsingle.tv_sec;
  uVar6 = (pCVar3->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar6;
  older.tv_sec = uVar5;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar12._0_12_,0);
  newer.tv_usec = SUB124(cVar12._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (*(int *)((long)pvVar4 + 8) == 0) {
    uVar7 = 1;
  }
  else {
    uVar11 = *(int *)((long)pvVar4 + 8) << (*(long *)((long)pvVar4 + 0x10) <= lVar9);
    uVar7 = 0xfa;
    if (uVar11 < 0xfa) {
      uVar7 = uVar11;
    }
    if ((lVar9 < *(long *)((long)pvVar4 + 0x10)) && (uVar11 < 0xfb)) goto LAB_00137ae7;
  }
  *(uint *)((long)pvVar4 + 8) = uVar7;
LAB_00137ae7:
  *(ulong *)((long)pvVar4 + 0x10) = lVar9 + (ulong)uVar7;
  Curl_expire(conn->data,(ulong)uVar7,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}